

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

string * __thiscall CGL::Application::info_abi_cxx11_(Application *this)

{
  long in_RSI;
  string *in_RDI;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11 [17];
  
  if (*(int *)(in_RSI + 0x18) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"MeshEdit",local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  else if (*(int *)(in_RSI + 0x18) - 1U < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"renderer",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  return in_RDI;
}

Assistant:

string Application::info() {
  switch (mode) {
    case EDIT_MODE:
      return "MeshEdit";
      break;
    case RENDER_MODE:
    case VISUALIZE_MODE:
      return "renderer";
      break;
  }
  return "";
}